

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateValue
          (HtmlparserCppTest *this,string *expected_value)

{
  __type _Var1;
  char *pcVar2;
  allocator local_39;
  string local_38 [8];
  string parsed_state;
  string *expected_value_local;
  HtmlparserCppTest *this_local;
  
  pcVar2 = HtmlParser::value(&this->parser_);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","parser_.value() != __null");
    exit(1);
  }
  pcVar2 = HtmlParser::value(&this->parser_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  _Var1 = std::operator==(expected_value,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  if (!_Var1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_value","==","parsed_state");
    exit(1);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void HtmlparserCppTest::ValidateValue(const string &expected_value) {
  EXPECT_TRUE(parser_.value() != NULL);
  const string parsed_state(parser_.value());
  EXPECT_EQ(expected_value, parsed_state)
      << "Unexpected value at line " << parser_.line_number();
}